

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_support_format_rar(archive *_a)

{
  int iVar1;
  void *format_data;
  int magic_test;
  int r;
  rar *rar;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_support_format_rar");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    format_data = calloc(0x4f18,1);
    if (format_data == (void *)0x0) {
      archive_set_error(_a,0xc,"Can\'t allocate rar data");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(undefined4 *)((long)format_data + 0x4f10) = 0xffffffff;
      _a_local._4_4_ =
           __archive_read_register_format
                     ((archive_read *)_a,format_data,"rar",archive_read_format_rar_bid,
                      archive_read_format_rar_options,archive_read_format_rar_read_header,
                      archive_read_format_rar_read_data,archive_read_format_rar_read_data_skip,
                      archive_read_format_rar_seek_data,archive_read_format_rar_cleanup,
                      archive_read_support_format_rar_capabilities,
                      archive_read_format_rar_has_encrypted_entries);
      if (_a_local._4_4_ != 0) {
        free(format_data);
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_format_rar(struct archive *_a)
{
  struct archive_read *a = (struct archive_read *)_a;
  struct rar *rar;
  int r;

  archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
                      "archive_read_support_format_rar");

  rar = (struct rar *)calloc(sizeof(*rar), 1);
  if (rar == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Can't allocate rar data");
    return (ARCHIVE_FATAL);
  }

	/*
	 * Until enough data has been read, we cannot tell about
	 * any encrypted entries yet.
	 */
	rar->has_encrypted_entries = ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW;

  r = __archive_read_register_format(a,
                                     rar,
                                     "rar",
                                     archive_read_format_rar_bid,
                                     archive_read_format_rar_options,
                                     archive_read_format_rar_read_header,
                                     archive_read_format_rar_read_data,
                                     archive_read_format_rar_read_data_skip,
                                     archive_read_format_rar_seek_data,
                                     archive_read_format_rar_cleanup,
                                     archive_read_support_format_rar_capabilities,
                                     archive_read_format_rar_has_encrypted_entries);

  if (r != ARCHIVE_OK)
    free(rar);
  return (r);
}